

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void InitScore(VP8ModeScore *rd)

{
  VP8ModeScore *rd_local;
  
  rd->D = 0;
  rd->SD = 0;
  rd->R = 0;
  rd->H = 0;
  rd->nz = 0;
  rd->score = 0x7fffffffffffff;
  return;
}

Assistant:

static void InitScore(VP8ModeScore* const rd) {
  rd->D  = 0;
  rd->SD = 0;
  rd->R  = 0;
  rd->H  = 0;
  rd->nz = 0;
  rd->score = MAX_COST;
}